

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderRelaxNGSetSchema(xmlTextReaderPtr reader,xmlRelaxNGPtr schema)

{
  xmlRelaxNGValidCtxtPtr pxVar1;
  xmlRelaxNGPtr schema_local;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (schema == (xmlRelaxNGPtr)0x0) {
    if (reader->rngSchemas != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFree(reader->rngSchemas);
      reader->rngSchemas = (xmlRelaxNGPtr)0x0;
    }
    if (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0) {
      if (reader->rngPreserveCtxt == 0) {
        xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
      }
      reader->rngValidCtxt = (xmlRelaxNGValidCtxtPtr)0x0;
    }
    reader->rngPreserveCtxt = 0;
    reader_local._4_4_ = 0;
  }
  else if (reader->mode == 0) {
    if (reader->rngSchemas != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFree(reader->rngSchemas);
      reader->rngSchemas = (xmlRelaxNGPtr)0x0;
    }
    if (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0) {
      if (reader->rngPreserveCtxt == 0) {
        xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
      }
      reader->rngValidCtxt = (xmlRelaxNGValidCtxtPtr)0x0;
    }
    reader->rngPreserveCtxt = 0;
    pxVar1 = xmlRelaxNGNewValidCtxt(schema);
    reader->rngValidCtxt = pxVar1;
    if (reader->rngValidCtxt == (xmlRelaxNGValidCtxtPtr)0x0) {
      reader_local._4_4_ = -1;
    }
    else {
      if (reader->errorFunc != (xmlTextReaderErrorFunc)0x0) {
        xmlRelaxNGSetValidErrors
                  (reader->rngValidCtxt,xmlTextReaderValidityErrorRelay,
                   xmlTextReaderValidityWarningRelay,reader);
      }
      if (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0) {
        xmlRelaxNGSetValidStructuredErrors
                  (reader->rngValidCtxt,xmlTextReaderValidityStructuredRelay,reader);
      }
      reader->rngValidErrors = 0;
      reader->rngFullNode = (xmlNodePtr)0x0;
      reader->validate = XML_TEXTREADER_VALIDATE_RNG;
      reader_local._4_4_ = 0;
    }
  }
  else {
    reader_local._4_4_ = -1;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderRelaxNGSetSchema(xmlTextReaderPtr reader, xmlRelaxNGPtr schema) {
    if (reader == NULL)
        return(-1);
    if (schema == NULL) {
        if (reader->rngSchemas != NULL) {
	    xmlRelaxNGFree(reader->rngSchemas);
	    reader->rngSchemas = NULL;
	}
        if (reader->rngValidCtxt != NULL) {
	    if (! reader->rngPreserveCtxt)
		xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
	    reader->rngValidCtxt = NULL;
        }
	reader->rngPreserveCtxt = 0;
	return(0);
    }
    if (reader->mode != XML_TEXTREADER_MODE_INITIAL)
	return(-1);
    if (reader->rngSchemas != NULL) {
	xmlRelaxNGFree(reader->rngSchemas);
	reader->rngSchemas = NULL;
    }
    if (reader->rngValidCtxt != NULL) {
	if (! reader->rngPreserveCtxt)
	    xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
	reader->rngValidCtxt = NULL;
    }
    reader->rngPreserveCtxt = 0;
    reader->rngValidCtxt = xmlRelaxNGNewValidCtxt(schema);
    if (reader->rngValidCtxt == NULL)
        return(-1);
    if (reader->errorFunc != NULL) {
	xmlRelaxNGSetValidErrors(reader->rngValidCtxt,
			xmlTextReaderValidityErrorRelay,
			xmlTextReaderValidityWarningRelay,
			reader);
    }
	if (reader->sErrorFunc != NULL) {
		xmlRelaxNGSetValidStructuredErrors(reader->rngValidCtxt,
			xmlTextReaderValidityStructuredRelay,
			reader);
    }
    reader->rngValidErrors = 0;
    reader->rngFullNode = NULL;
    reader->validate = XML_TEXTREADER_VALIDATE_RNG;
    return(0);
}